

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  FieldDescriptor *in_RDI;
  JavaType type;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  Printer *in_stack_00000038;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000040;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  Printer *in_stack_000000b0;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  
  bVar1 = IsByteStringWithCustomDefaultValue(in_RDI);
  if (bVar1) {
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  PrintExtraFieldInfo(in_stack_00000040,in_stack_00000038);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x59c8f4);
  if (bVar1) {
    WriteFieldAccessorDocComment
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  }
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  JVar2 = GetJavaType((FieldDescriptor *)in_stack_00000038);
  if ((JVar2 == JAVATYPE_STRING) || (JVar2 == JAVATYPE_BYTES)) {
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  else {
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  if (IsByteStringWithCustomDefaultValue(descriptor_)) {
    // allocate this once statically since we know ByteStrings are immutable
    // values that can be reused.
    printer->Print(
        variables_,
        "private static final $field_type$ $bytes_default$ = $default$;\n");
  }
  printer->Print(variables_, "private $field_type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $get_has_field_bit_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "$null_check$"
                 "  $set_has_field_bit_message$\n"
                 "  $name$_ = value;\n"
                 "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $clear_has_field_bit_message$\n");
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(
        variables_,
        "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_, "  $name$_ = $default$;\n");
  }
  printer->Print(variables_, "}\n");
}